

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O3

void __thiscall
Assimp::MakeVerboseFormatProcess::Execute(MakeVerboseFormatProcess *this,aiScene *pScene)

{
  byte bVar1;
  bool bVar2;
  Logger *pLVar3;
  ulong uVar4;
  byte bVar5;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/MakeVerboseFormat.cpp"
                  ,0x43,"virtual void Assimp::MakeVerboseFormatProcess::Execute(aiScene *)");
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"MakeVerboseFormatProcess begin");
  if (pScene->mNumMeshes != 0) {
    uVar4 = 0;
    bVar1 = 0;
    do {
      bVar5 = bVar1;
      bVar2 = MakeVerboseFormat((MakeVerboseFormatProcess *)pLVar3,pScene->mMeshes[uVar4]);
      uVar4 = uVar4 + 1;
      bVar1 = bVar5 | bVar2;
    } while (uVar4 < pScene->mNumMeshes);
    if (bVar5 != 0 || bVar2) {
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,"MakeVerboseFormatProcess finished. There was much work to do ...");
      goto LAB_002fb2d2;
    }
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"MakeVerboseFormatProcess. There was nothing to do.");
LAB_002fb2d2:
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags & 0xf7;
  return;
}

Assistant:

void MakeVerboseFormatProcess::Execute( aiScene* pScene)
{
    ai_assert(NULL != pScene);
    ASSIMP_LOG_DEBUG("MakeVerboseFormatProcess begin");

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
    {
        if( MakeVerboseFormat( pScene->mMeshes[a]))
            bHas = true;
    }
    if (bHas) {
        ASSIMP_LOG_INFO("MakeVerboseFormatProcess finished. There was much work to do ...");
    } else {
        ASSIMP_LOG_DEBUG("MakeVerboseFormatProcess. There was nothing to do.");
    }

    pScene->mFlags &= ~AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
}